

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SequenceConcatExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceConcatExpr,std::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
          (BumpAllocator *this,
          span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *args)

{
  pointer pEVar1;
  size_t sVar2;
  SequenceConcatExpr *pSVar3;
  
  pSVar3 = (SequenceConcatExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SequenceConcatExpr *)this->endPtr < pSVar3 + 1) {
    pSVar3 = (SequenceConcatExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pSVar3 + 1);
  }
  pEVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pSVar3->super_AssertionExpr).kind = SequenceConcat;
  (pSVar3->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  (pSVar3->elements)._M_ptr = pEVar1;
  (pSVar3->elements)._M_extent._M_extent_value = sVar2;
  return pSVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }